

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O0

void __thiscall Database_Allocate16Bytes_Test::TestBody(Database_Allocate16Bytes_Test *this)

{
  bool bVar1;
  shared_ptr<pstore::file::in_memory> *file;
  char *pcVar2;
  value_type vVar3;
  AssertHelper local_1b8;
  Message local_1b0;
  value_type local_1a8;
  unsigned_long local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  address addr2;
  Message local_178;
  value_type local_170;
  unsigned_long local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  address local_140;
  address addr;
  uint align;
  uint size;
  database db;
  Database_Allocate16Bytes_Test *this_local;
  
  db.sync_name_.field_2._8_8_ = this;
  file = in_memory_store::file(&(this->super_Database).store_);
  pstore::database::database<pstore::file::in_memory>((database *)&align,file,true);
  pstore::database::set_vacuum_mode((database *)&align,disabled);
  addr.a_._4_4_ = 0x10;
  addr.a_._0_4_ = 1;
  local_140 = pstore::database::allocate((database *)&align,0x10,1);
  local_168 = 0xb0;
  local_170 = pstore::address::absolute(&local_140);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_160,"pstore::leader_size + sizeof (pstore::trailer)",
             "addr.absolute ()",&local_168,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr2,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr2);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::database::allocate((database *)&align,0x10,1);
  vVar3 = pstore::address::absolute(&local_140);
  local_1a0 = vVar3 + 0x10;
  local_1a8 = pstore::address::absolute((address *)&gtest_ar_1.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"addr.absolute () + 16","addr2.absolute ()",&local_1a0,&local_1a8
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  pstore::database::~database((database *)&align);
  return;
}

Assistant:

TEST_F (Database, Allocate16Bytes) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // Initial allocation.
    constexpr auto size = 16U;
    constexpr auto align = 1U;
    pstore::address addr = db.allocate (size, align);
    EXPECT_EQ (pstore::leader_size + sizeof (pstore::trailer), addr.absolute ());

    // Subsequent allocation.
    pstore::address addr2 = db.allocate (size, align);
    EXPECT_EQ (addr.absolute () + 16, addr2.absolute ());
}